

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O1

time_t lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)

{
  uchar *__s;
  size_t sVar1;
  long lVar2;
  time_t tVar3;
  tm local_48;
  
  __s = as->data;
  local_48._32_8_ = 0;
  local_48.tm_gmtoff = 0;
  local_48.tm_mon = 0;
  local_48.tm_year = 0;
  local_48.tm_wday = 0;
  local_48.tm_yday = 0;
  local_48.tm_sec = 0;
  local_48.tm_min = 0;
  local_48.tm_hour = 0;
  local_48.tm_mday = 0;
  local_48.tm_zone = (char *)0x0;
  sVar1 = strlen((char *)__s);
  if (sVar1 == 0xd) {
    local_48.tm_year = (int)(char)__s[1] + (char)*__s * 10 + -0x1ac;
    lVar2 = 2;
  }
  else {
    local_48.tm_year =
         (int)(char)__s[3] + (char)__s[1] * 100 + (char)*__s * 1000 + (char)__s[2] * 10 + -0xd050;
    lVar2 = 4;
  }
  local_48.tm_mon = (int)(char)__s[lVar2 + 1] + (char)__s[lVar2] * 10 + -0x211;
  local_48.tm_mday = (int)(char)__s[lVar2 + 3] + (char)__s[lVar2 + 2] * 10 + -0x211;
  local_48.tm_hour = (int)(char)__s[lVar2 + 5] + (char)__s[lVar2 + 4] * 10 + -0x210;
  local_48.tm_min = (int)(char)__s[lVar2 + 7] + (char)__s[lVar2 + 6] * 10 + -0x210;
  local_48.tm_sec = (int)(char)__s[lVar2 + 9] + (char)__s[lVar2 + 8] * 10 + -0x210;
  local_48._32_8_ = local_48._32_8_ & 0xffffffff00000000;
  tVar3 = mktime(&local_48);
  return tVar3;
}

Assistant:

static time_t
lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)
{
#if !defined(LWS_PLAT_OPTEE)

	const char *p = (const char *)as->data;
	struct tm t;

	/* [YY]YYMMDDHHMMSSZ */

	memset(&t, 0, sizeof(t));

	if (strlen(p) == 13) {
		t.tm_year = (dec(p[0]) * 10) + dec(p[1]) + 100;
		p += 2;
	} else {
		t.tm_year = (dec(p[0]) * 1000) + (dec(p[1]) * 100) +
			    (dec(p[2]) * 10) + dec(p[3]);
		p += 4;
	}
	t.tm_mon = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_mday = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_hour = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_min = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_sec = (dec(p[0]) * 10) + dec(p[1]);
	t.tm_isdst = 0;

	return mktime(&t);
#else
	return (time_t)-1;
#endif
}